

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACES_Sequence_Parser.cpp
# Opt level: O1

SequenceParser * __thiscall
AS_02::ACES::SequenceParser::OpenRead
          (SequenceParser *this,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,bool pedantic,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *target_frame_file_list)

{
  h__SequenceParser *this_00;
  h__SequenceParser *this_01;
  long in_R8;
  
  this_01 = (h__SequenceParser *)operator_new(0x120);
  h__SequenceParser::h__SequenceParser(this_01);
  this_00 = (h__SequenceParser *)
            (file_list->
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl._M_node.super__List_node_base._M_prev;
  if (this_00 != (h__SequenceParser *)0x0) {
    h__SequenceParser::~h__SequenceParser(this_00);
    operator_delete(this_00,0x120);
  }
  (file_list->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_01;
  h__SequenceParser::OpenRead
            ((h__SequenceParser *)this,
             (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_01,pedantic);
  if ((-1 < *(int *)&this->_vptr_SequenceParser) && (*(long *)(in_R8 + 0x10) != 0)) {
    h__SequenceParser::OpenTargetFrameSequenceRead
              ((h__SequenceParser *)&stack0xffffffffffffff68,
               (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(file_list->
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl._M_node.super__List_node_base._M_prev);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&stack0xffffffffffffff68);
    Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
  }
  if (*(int *)&this->_vptr_SequenceParser < 0) {
    (file_list->
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  }
  return this;
}

Assistant:

AS_02::Result_t AS_02::ACES::SequenceParser::OpenRead(const std::list<std::string> &file_list, bool pedantic /*= false*/, const std::list<std::string> &target_frame_file_list /* = std::list<std::string>()*/) const
{

  const_cast<AS_02::ACES::SequenceParser*>(this)->m_Parser = new h__SequenceParser;

  Result_t result = m_Parser->OpenRead(file_list, pedantic);

  if(ASDCP_SUCCESS(result))
    if (target_frame_file_list.size() > 0 ) result = m_Parser->OpenTargetFrameSequenceRead(target_frame_file_list);

  if(ASDCP_FAILURE(result))
    const_cast<AS_02::ACES::SequenceParser*>(this)->m_Parser.release();

  return result;
}